

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
TypeFunction::TypeFunction
          (TypeFunction *this,InplaceStr name,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  byte bVar1;
  TypeHandle *el;
  TypeHandle *pTVar2;
  
  pTVar2 = arguments.head;
  TypeBase::TypeBase(&this->super_TypeBase,0x15,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003e3200;
  this->returnType = returnType;
  (this->arguments).head = pTVar2;
  (this->arguments).tail = arguments.tail;
  (this->super_TypeBase).size = 0xc;
  bVar1 = returnType->isGeneric;
  (this->super_TypeBase).isGeneric = (bool)bVar1;
  for (; pTVar2 != (TypeHandle *)0x0; pTVar2 = pTVar2->next) {
    bVar1 = bVar1 | pTVar2->type->isGeneric;
    (this->super_TypeBase).isGeneric = (bool)bVar1;
  }
  (this->super_TypeBase).hasPointers = true;
  return;
}

Assistant:

TypeFunction(InplaceStr name, TypeBase *returnType, IntrusiveList<TypeHandle> arguments): TypeBase(myTypeID, name), returnType(returnType), arguments(arguments)
	{
		size = 4 + NULLC_PTR_SIZE;

		isGeneric = returnType->isGeneric;

		for(TypeHandle *el = arguments.head; el; el = el->next)
			isGeneric |= el->type->isGeneric;

		hasPointers = true;
	}